

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O3

void __thiscall luna::Lexer::LexStringChar(Lexer *this)

{
  String *pSVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ulong in_RAX;
  LexException *this_00;
  undefined8 *puVar5;
  anon_union_16_2_eed97686_for_String_2 *paVar6;
  char *__nptr;
  int i;
  long lVar7;
  char hex [3];
  char oct [4];
  undefined8 local_28;
  
  __nptr = (char *)&local_28;
  if (this->current_ != 0x5c) goto LAB_0014c61c;
  local_28 = in_RAX;
  iVar4 = Next(this);
  this->current_ = iVar4;
  if (0x61 < iVar4) {
    switch(iVar4) {
    case 0x6e:
      break;
    case 0x72:
      break;
    case 0x74:
      break;
    case 0x76:
      break;
    case 0x78:
      iVar4 = Next(this);
      this->current_ = iVar4;
      local_28 = local_28 & 0xffffffffff000000;
      puVar5 = &local_28;
      bVar3 = true;
      do {
        bVar2 = bVar3;
        if ((9 < iVar4 - 0x30U) &&
           ((0x25 < iVar4 - 0x41U || ((0x3f0000003fU >> ((ulong)(iVar4 - 0x41U) & 0x3f) & 1) == 0)))
           ) {
          if (bVar2) {
            this_00 = (LexException *)__cxa_allocate_exception(0x20);
            pSVar1 = this->module_;
            if ((pSVar1->super_GCObject).field_0x11 == '\0') {
              paVar6 = &pSVar1->field_1;
            }
            else {
              paVar6 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
            }
            LexException::LexException<char_const(&)[30]>
                      (this_00,paVar6->str_buffer_,this->line_,this->column_,
                       (char (*) [30])"unexpect character after \'\\x\'");
            goto LAB_0014c7f0;
          }
          break;
        }
        *(char *)puVar5 = (char)iVar4;
        iVar4 = Next(this);
        this->current_ = iVar4;
        puVar5 = (undefined8 *)((long)&local_28 + 1);
        bVar3 = false;
      } while (bVar2);
      iVar4 = 0x10;
      goto LAB_0014c74a;
    default:
      if ((iVar4 == 0x62) || (iVar4 == 0x66)) break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x77:
switchD_0014c608_caseD_6f:
      if (9 < iVar4 - 0x30U) {
        this_00 = (LexException *)__cxa_allocate_exception(0x20);
        pSVar1 = this->module_;
        if ((pSVar1->super_GCObject).field_0x11 == '\0') {
          paVar6 = &pSVar1->field_1;
        }
        else {
          paVar6 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
        }
        LexException::LexException<char_const(&)[29]>
                  (this_00,paVar6->str_buffer_,this->line_,this->column_,
                   (char (*) [29])"unexpect character after \'\\\'");
LAB_0014c7f0:
        __cxa_throw(this_00,&LexException::typeinfo,Exception::~Exception);
      }
      local_28 = local_28 & 0xffffffff;
      lVar7 = 0;
      do {
        if (9 < iVar4 - 0x30U) break;
        *(char *)((long)&local_28 + lVar7 + 4) = (char)iVar4;
        lVar7 = lVar7 + 1;
        iVar4 = Next(this);
        this->current_ = iVar4;
      } while (lVar7 != 3);
      __nptr = (char *)((long)&local_28 + 4);
      iVar4 = 8;
LAB_0014c74a:
      strtoul(__nptr,(char **)0x0,iVar4);
      std::__cxx11::string::push_back((char)this + '@');
      return;
    }
LAB_0014c61c:
    std::__cxx11::string::push_back((char)this + '@');
    iVar4 = Next(this);
    this->current_ = iVar4;
    return;
  }
  if (iVar4 < 0x5c) {
    if ((iVar4 == 0x22) || (iVar4 == 0x27)) goto LAB_0014c61c;
  }
  else if ((iVar4 == 0x5c) || (iVar4 == 0x61)) goto LAB_0014c61c;
  goto switchD_0014c608_caseD_6f;
}

Assistant:

void Lexer::LexStringChar()
    {
        if (current_ == '\\')
        {
            current_ = Next();
            if (current_ == 'a')
                token_buffer_.push_back('\a');
            else if (current_ == 'b')
                token_buffer_.push_back('\b');
            else if (current_ == 'f')
                token_buffer_.push_back('\f');
            else if (current_ == 'n')
                token_buffer_.push_back('\n');
            else if (current_ == 'r')
                token_buffer_.push_back('\r');
            else if (current_ == 't')
                token_buffer_.push_back('\t');
            else if (current_ == 'v')
                token_buffer_.push_back('\v');
            else if (current_ == '\\')
                token_buffer_.push_back('\\');
            else if (current_ == '"')
                token_buffer_.push_back('"');
            else if (current_ == '\'')
                token_buffer_.push_back('\'');
            else if (current_ == 'x')
            {
                current_ = Next();
                char hex[3] = { 0 };
                int i = 0;
                for (; i < 2 && IsHexChar(current_); ++i, current_ = Next())
                    hex[i] = current_;
                if (i == 0)
                    throw LexException(module_->GetCStr(), line_, column_,
                            "unexpect character after '\\x'");
                token_buffer_.push_back(static_cast<char>(strtoul(hex, 0, 16)));
                return ;
            }
            else if (isdigit(current_))
            {
                char oct[4] = { 0 };
                for (int i = 0; i < 3 && isdigit(current_); ++i, current_ = Next())
                    oct[i] = current_;
                token_buffer_.push_back(static_cast<char>(strtoul(oct, 0, 8)));
                return ;
            }
            else
                throw LexException(module_->GetCStr(), line_, column_,
                        "unexpect character after '\\'");
        }
        else
        {
            token_buffer_.push_back(current_);
        }

        current_ = Next();
    }